

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O3

ModelWireSegment * __thiscall lsim::ModelWire::add_segment(ModelWire *this,Point *p0,Point *p1)

{
  ModelWireSegment *pMVar1;
  ModelWireJunction *pMVar2;
  pointer *__ptr;
  _Head_base<0UL,_lsim::ModelWireSegment_*,_false> local_28;
  
  pMVar1 = (ModelWireSegment *)operator_new(0x18);
  ModelWireSegment::ModelWireSegment(pMVar1,this);
  local_28._M_head_impl = pMVar1;
  std::
  vector<std::unique_ptr<lsim::ModelWireSegment,std::default_delete<lsim::ModelWireSegment>>,std::allocator<std::unique_ptr<lsim::ModelWireSegment,std::default_delete<lsim::ModelWireSegment>>>>
  ::
  emplace_back<std::unique_ptr<lsim::ModelWireSegment,std::default_delete<lsim::ModelWireSegment>>>
            ((vector<std::unique_ptr<lsim::ModelWireSegment,std::default_delete<lsim::ModelWireSegment>>,std::allocator<std::unique_ptr<lsim::ModelWireSegment,std::default_delete<lsim::ModelWireSegment>>>>
              *)&this->m_segments,
             (unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_> *)
             &local_28);
  if (local_28._M_head_impl != (ModelWireSegment *)0x0) {
    operator_delete(local_28._M_head_impl,0x18);
  }
  pMVar1 = (this->m_segments).
           super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
           ._M_t.
           super__Tuple_impl<0UL,_lsim::ModelWireSegment_*,_std::default_delete<lsim::ModelWireSegment>_>
           .super__Head_base<0UL,_lsim::ModelWireSegment_*,_false>._M_head_impl;
  pMVar2 = add_junction(this,p0,pMVar1);
  (pMVar1->m_ends)._M_elems[0] = pMVar2;
  pMVar2 = add_junction(this,p1,pMVar1);
  *(ModelWireJunction **)((long)(pMVar1->m_ends)._M_elems + 8) = pMVar2;
  return pMVar1;
}

Assistant:

ModelWireSegment *ModelWire::add_segment(const Point &p0, const Point &p1) {
    m_segments.push_back(std::make_unique<ModelWireSegment>(this));
    auto segment = m_segments.back().get();

    segment->set_junction(0, add_junction(p0, segment));
    segment->set_junction(1, add_junction(p1, segment));
    return segment;
}